

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmEndMacroCommand.cxx
# Opt level: O0

bool __thiscall
cmEndMacroCommand::InvokeInitialPass
          (cmEndMacroCommand *this,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *param_1,
          cmExecutionStatus *param_2)

{
  allocator local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *param_2_local;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *param_1_local;
  cmEndMacroCommand *this_local;
  
  local_20 = param_2;
  param_2_local = (cmExecutionStatus *)param_1;
  param_1_local = (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_40,
             "An ENDMACRO command was found outside of a proper MACRO ENDMACRO structure. Or its arguments did not match the opening MACRO command."
             ,&local_41);
  cmCommand::SetError(&this->super_cmCommand,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return false;
}

Assistant:

bool cmEndMacroCommand
::InvokeInitialPass(std::vector<cmListFileArgument> const&,
                    cmExecutionStatus &)
{
  this->SetError("An ENDMACRO command was found outside of a proper "
                 "MACRO ENDMACRO structure. Or its arguments did not "
                 "match the opening MACRO command.");
  return false;
}